

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O0

void __thiscall
CppUnit::PlugInManager::load
          (PlugInManager *this,string *libraryFileName,PlugInParameters *parameters)

{
  DynamicLibraryManager *pDVar1;
  code *pcVar2;
  TestFactoryRegistry *pTVar3;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  code *local_68;
  TestPlugInSignature plug;
  undefined1 local_50 [8];
  PlugInInfo info;
  PlugInParameters *parameters_local;
  string *libraryFileName_local;
  PlugInManager *this_local;
  
  info.m_interface = (CppUnitTestPlugIn *)parameters;
  PlugInInfo::PlugInInfo((PlugInInfo *)local_50);
  std::__cxx11::string::operator=((string *)local_50,(string *)libraryFileName);
  pDVar1 = (DynamicLibraryManager *)operator_new(0x28);
  DynamicLibraryManager::DynamicLibraryManager(pDVar1,libraryFileName);
  info.m_fileName.field_2._8_8_ = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"cppunitTestPlugIn",&local_89);
  pcVar2 = (code *)DynamicLibraryManager::findSymbol(pDVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_68 = pcVar2;
  info.m_manager = (DynamicLibraryManager *)(*pcVar2)();
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  push_back(&this->m_plugIns,(value_type *)local_50);
  pDVar1 = info.m_manager;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"All Tests",&local_b1);
  pTVar3 = TestFactoryRegistry::getRegistry(&local_b0);
  (**pDVar1->m_libraryHandle)(pDVar1,pTVar3,info.m_interface);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  PlugInInfo::~PlugInInfo((PlugInInfo *)local_50);
  return;
}

Assistant:

void
PlugInManager::load( const std::string &libraryFileName,
                     const PlugInParameters &parameters )
{
  PlugInInfo info;
  info.m_fileName = libraryFileName;
  info.m_manager = new DynamicLibraryManager( libraryFileName );

  TestPlugInSignature plug = (TestPlugInSignature)((uintptr_t)info.m_manager->findSymbol( 
        CPPUNIT_STRINGIZE( CPPUNIT_PLUGIN_EXPORTED_NAME ) ));
  info.m_interface = (*plug)();

  m_plugIns.push_back( info );
  
  info.m_interface->initialize( &TestFactoryRegistry::getRegistry(), parameters );
}